

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unhexFunc(sqlite3_context *pCtx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  u32 uVar6;
  byte *pbVar7;
  uchar *puVar8;
  u32 uVar9;
  byte bVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  byte *local_60;
  byte *local_48;
  uchar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar7 = (byte *)sqlite3ValueText(*argv,'\x01');
  local_48 = pbVar7;
  iVar4 = sqlite3ValueBytes(*argv,'\x01');
  if (argc == 2) {
    puVar8 = (uchar *)sqlite3ValueText(argv[1],'\x01');
    iVar5 = sqlite3ValueBytes(argv[1],'\x01');
    lVar11 = (long)iVar5;
  }
  else {
    puVar8 = "";
    lVar11 = 0;
  }
  if (puVar8 == (uchar *)0x0 || pbVar7 == (byte *)0x0) {
LAB_001b0a6f:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    pbVar7 = (byte *)contextMalloc(pCtx,(long)(iVar4 / 2 + 1));
    iVar4 = 0;
    if (pbVar7 == (byte *)0x0) {
      iVar5 = 0;
    }
    else {
      bVar10 = *local_48;
      local_60 = pbVar7;
      if (bVar10 != 0) {
        do {
          while ((""[bVar10] & 8) == 0) {
            uVar9 = (u32)(char)*local_48;
            if ((char)*local_48 < '\0') {
              uVar9 = sqlite3Utf8Read(&local_48);
              local_40 = puVar8;
            }
            else {
              local_48 = local_48 + 1;
              local_40 = puVar8;
            }
            do {
              puVar3 = local_40;
              if (puVar8 + lVar11 <= local_40) {
                iVar4 = 6;
                bVar12 = false;
                goto LAB_001b09e1;
              }
              uVar6 = (u32)(char)*local_40;
              if ((char)*local_40 < '\0') {
                uVar6 = sqlite3Utf8Read(&local_40);
              }
              else {
                local_40 = local_40 + 1;
              }
            } while (uVar6 != uVar9);
            if (puVar3 < puVar8 + lVar11) {
              bVar10 = *local_48;
              bVar12 = bVar10 != 0;
              iVar4 = 7;
              if (bVar12) {
                iVar4 = 0;
              }
            }
            else {
              bVar12 = false;
              iVar4 = 6;
            }
LAB_001b09e1:
            if (!bVar12) goto LAB_001b0a57;
          }
          pbVar1 = local_48 + 2;
          bVar2 = local_48[1];
          local_48 = pbVar1;
          if ((""[bVar2] & 8) == 0) {
            iVar4 = 6;
            goto LAB_001b0a57;
          }
          *local_60 = ((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf |
                      (((char)(bVar10 * '\x02') >> 7 & 9U) + bVar10) * '\x10';
          local_60 = local_60 + 1;
          bVar10 = *pbVar1;
        } while (bVar10 != 0);
        iVar4 = 0;
      }
LAB_001b0a57:
      iVar5 = (int)local_60;
      if (iVar4 != 7) {
        if (iVar4 == 6) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            sqlite3_free(pbVar7);
            return;
          }
          goto LAB_001b0aef;
        }
        if (iVar4 != 0) goto LAB_001b0a6f;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      setResultStrOrError(pCtx,(char *)pbVar7,iVar5 - (int)pbVar7,'\0',sqlite3_free);
      return;
    }
  }
LAB_001b0aef:
  __stack_chk_fail();
}

Assistant:

static void unhexFunc(
  sqlite3_context *pCtx,
  int argc,
  sqlite3_value **argv
){
  const u8 *zPass = (const u8*)"";
  int nPass = 0;
  const u8 *zHex = sqlite3_value_text(argv[0]);
  int nHex = sqlite3_value_bytes(argv[0]);
#ifdef SQLITE_DEBUG
  const u8 *zEnd = zHex ? &zHex[nHex] : 0;
#endif
  u8 *pBlob = 0;
  u8 *p = 0;

  assert( argc==1 || argc==2 );
  if( argc==2 ){
    zPass = sqlite3_value_text(argv[1]);
    nPass = sqlite3_value_bytes(argv[1]);
  }
  if( !zHex || !zPass ) return;

  p = pBlob = contextMalloc(pCtx, (nHex/2)+1);
  if( pBlob ){
    u8 c;                         /* Most significant digit of next byte */
    u8 d;                         /* Least significant digit of next byte */

    while( (c = *zHex)!=0x00 ){
      while( !sqlite3Isxdigit(c) ){
        u32 ch = Utf8Read(zHex);
        assert( zHex<=zEnd );
        if( !strContainsChar(zPass, nPass, ch) ) goto unhex_null;
        c = *zHex;
        if( c==0x00 ) goto unhex_done;
      }
      zHex++;
      assert( *zEnd==0x00 );
      assert( zHex<=zEnd );
      d = *(zHex++);
      if( !sqlite3Isxdigit(d) ) goto unhex_null;
      *(p++) = (sqlite3HexToInt(c)<<4) | sqlite3HexToInt(d);
    }
  }

 unhex_done:
  sqlite3_result_blob(pCtx, pBlob, (p - pBlob), sqlite3_free);
  return;

 unhex_null:
  sqlite3_free(pBlob);
  return;
}